

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O2

void __thiscall HighsSparseVectorSum::clear(HighsSparseVectorSum *this)

{
  pointer pHVar1;
  pointer pHVar2;
  int *piVar3;
  int *piVar4;
  iterator __begin2;
  size_type __n;
  int *piVar5;
  value_type local_18;
  
  piVar4 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar2 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
              .super__Vector_impl_data._M_finish - (long)pHVar2 >> 4;
  piVar5 = piVar3;
  if ((ulong)(((long)piVar4 - (long)piVar3 >> 2) * 10) < __n * 3) {
    for (; piVar5 != piVar4; piVar5 = piVar5 + 1) {
      pHVar1 = pHVar2 + *piVar5;
      pHVar1->hi = 0.0;
      pHVar1->lo = 0.0;
    }
  }
  else {
    local_18.hi = 0.0;
    local_18.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&this->values,__n,&local_18);
    piVar3 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (piVar4 != piVar3) {
    (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  return;
}

Assistant:

void clear() {
    if (10 * nonzeroinds.size() < 3 * values.size())
      for (HighsInt i : nonzeroinds) values[i] = 0.0;
    else
      values.assign(values.size(), false);

    nonzeroinds.clear();
  }